

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int gc_age(lua_State *L)

{
  StkId pTVar1;
  GCObject *obj;
  TValue *o;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  pTVar1 = L->ci->func;
  if ((pTVar1[1].tt_ & 0x8000) == 0) {
    lua_pushstring(L,"no collectable");
  }
  else {
    if ((pTVar1[1].tt_ & 0x8000) == 0) {
      __assert_fail("(((o)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x2f3,"int gc_age(lua_State *)");
    }
    lua_pushstring(L,gc_age::gennames[(int)((pTVar1[1].value_.gc)->marked & 7)]);
  }
  return 1;
}

Assistant:

static int gc_age (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    lua_pushstring(L, "no collectable");
  else {
    static const char *gennames[] = {"new", "survival", "old0", "old1",
                                     "old", "touched1", "touched2"};
    GCObject *obj = gcvalue(o);
    lua_pushstring(L, gennames[getage(obj)]);
  }
  return 1;
}